

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.c
# Opt level: O1

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)

{
  uint uVar1;
  ALLEGRO_BITMAP *pAVar2;
  ALLEGRO_DISPLAY *pAVar3;
  char *func;
  int line;
  ALLEGRO_BITMAP *in_RDI;
  ALLEGRO_BITMAP *local_20;
  
  if (in_RDI == (ALLEGRO_BITMAP *)0x0) {
    return;
  }
  local_20 = in_RDI;
  pAVar2 = al_get_target_bitmap();
  if (pAVar2 == in_RDI) {
    pAVar3 = al_get_current_display();
    if (pAVar3 == (ALLEGRO_DISPLAY *)0x0) {
      pAVar2 = (ALLEGRO_BITMAP *)0x0;
    }
    else {
      pAVar2 = al_get_backbuffer(pAVar3);
    }
    al_set_target_bitmap(pAVar2);
  }
  _al_set_bitmap_shader_field(local_20,(ALLEGRO_SHADER *)0x0);
  _al_unregister_destructor(_al_dtor_list,local_20->dtor_item);
  pAVar2 = local_20;
  if (local_20->parent != (ALLEGRO_BITMAP *)0x0) goto LAB_001413f8;
  uVar1 = local_20->_flags;
  if ((uVar1 & 1) == 0) {
    pAVar3 = local_20->_display;
    if (local_20->locked == true) {
      al_unlock_bitmap(local_20);
    }
    if (local_20->vt != (ALLEGRO_BITMAP_INTERFACE *)0x0) {
      (*local_20->vt->destroy_bitmap)(local_20);
    }
    if (pAVar3 != (ALLEGRO_DISPLAY *)0x0) {
      _al_vector_find_and_delete(&pAVar3->bitmaps,&local_20);
    }
    pAVar2 = (ALLEGRO_BITMAP *)local_20->memory;
    if (pAVar2 != (ALLEGRO_BITMAP *)0x0) {
      func = "al_destroy_bitmap";
      line = 0xf5;
      goto LAB_001413ed;
    }
  }
  else {
    _al_unregister_convert_bitmap((ALLEGRO_BITMAP *)0x1413b3);
    if (pAVar2->memory != (uchar *)0x0) {
      al_free_with_context
                (pAVar2->memory,0x5b,
                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
                 ,"destroy_memory_bitmap");
    }
    func = "destroy_memory_bitmap";
    line = 0x5c;
LAB_001413ed:
    al_free_with_context
              (pAVar2,line,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
               ,func);
  }
  if ((uVar1 & 1) != 0) {
    return;
  }
LAB_001413f8:
  al_free_with_context
            (local_20,0xf8,
             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/bitmap.c"
             ,"al_destroy_bitmap");
  return;
}

Assistant:

void al_destroy_bitmap(ALLEGRO_BITMAP *bitmap)
{
   if (!bitmap) {
      return;
   }

   /* As a convenience, implicitly untarget the bitmap on the calling thread
    * before it is destroyed, but maintain the current display.
    */
   if (bitmap == al_get_target_bitmap()) {
      ALLEGRO_DISPLAY *display = al_get_current_display();
      if (display)
         al_set_target_bitmap(al_get_backbuffer(display));
      else
         al_set_target_bitmap(NULL);
   }

   _al_set_bitmap_shader_field(bitmap, NULL);

   _al_unregister_destructor(_al_dtor_list, bitmap->dtor_item);

   if (!al_is_sub_bitmap(bitmap)) {
      ALLEGRO_DISPLAY* disp = _al_get_bitmap_display(bitmap);
      if (al_get_bitmap_flags(bitmap) & ALLEGRO_MEMORY_BITMAP) {
         destroy_memory_bitmap(bitmap);
         return;
      }

      /* Else it's a display bitmap */

      if (bitmap->locked)
         al_unlock_bitmap(bitmap);

      if (bitmap->vt)
         bitmap->vt->destroy_bitmap(bitmap);

      if (disp)
         _al_vector_find_and_delete(&disp->bitmaps, &bitmap);

      if (bitmap->memory)
         al_free(bitmap->memory);
   }

   al_free(bitmap);
}